

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cc
# Opt level: O2

void __thiscall Matrix::Matrix(Matrix *this,int nx,int ny)

{
  pointer piVar1;
  pointer pdVar2;
  vector<double,_std::allocator<double>_> *this_00;
  ulong uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  size_type __new_size;
  int upper;
  int lower;
  int right;
  int left;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  vector<double,_std::allocator<double>_> *local_50;
  vector<int,_std::allocator<int>_> *local_48;
  Matrix *local_40;
  pointer local_38;
  
  uVar4 = ny * nx;
  (this->values).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  (this->values).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  (this->col_inds).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->col_inds).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->row_ptrs).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->col_inds).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->row_ptrs).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->row_ptrs).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->values).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  local_50 = &this->values;
  local_48 = &this->col_inds;
  local_40 = this;
  std::vector<int,_std::allocator<int>_>::resize(&this->row_ptrs,(long)(int)(uVar4 + 1));
  std::vector<int,_std::allocator<int>_>::resize(&this->col_inds,(long)(int)(uVar4 * 5));
  std::vector<double,_std::allocator<double>_>::resize(&this->values,(long)(int)(uVar4 * 5));
  local_38 = (this->row_ptrs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
  *local_38 = 0;
  piVar1 = (this->col_inds).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar8 = 0;
  uVar3 = (ulong)uVar4;
  if ((int)uVar4 < 1) {
    uVar3 = uVar8;
  }
  pdVar2 = (this->values).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar5 = 0;
  for (; this_00 = local_50, __new_size = (size_type)iVar5, uVar3 != uVar8; uVar8 = uVar8 + 1) {
    get_2d_neighbors((int)uVar8,nx,ny,&local_54,&local_58,&local_5c,&local_60);
    if (local_5c != -1) {
      piVar1[__new_size] = local_5c;
      iVar5 = iVar5 + 1;
      pdVar2[__new_size] = -1.0;
    }
    iVar6 = iVar5;
    if (local_54 != -1) {
      piVar1[iVar5] = local_54;
      iVar6 = iVar5 + 1;
      pdVar2[iVar5] = -1.0;
    }
    piVar1[iVar6] = (int)uVar8;
    iVar5 = iVar6 + 1;
    pdVar2[iVar6] = 4.0;
    iVar7 = iVar5;
    if (local_58 != -1) {
      piVar1[iVar5] = local_58;
      iVar7 = iVar6 + 2;
      pdVar2[iVar5] = -1.0;
    }
    iVar5 = iVar7;
    if (local_60 != -1) {
      piVar1[iVar7] = local_60;
      iVar5 = iVar7 + 1;
      pdVar2[iVar7] = -1.0;
    }
    local_38[uVar8 + 1] = iVar5;
  }
  std::vector<int,_std::allocator<int>_>::resize(local_48,__new_size);
  std::vector<double,_std::allocator<double>_>::resize(this_00,__new_size);
  return;
}

Assistant:

Matrix::Matrix(int nx, int ny) {
    int num_rows = nx*ny;
    int nnz_est  = 5*num_rows;

    row_ptrs.resize(num_rows+1);
    col_inds.resize(nnz_est);
    values  .resize(nnz_est);

    int center, left, right, lower, upper, ind = 0;

    row_ptrs[0] = 0;
    for (int i = 0; i < num_rows; i++) {
        center = i;

        get_2d_neighbors(center, nx, ny, left, right, lower, upper);

        if (lower != -1) { col_inds[ind] = lower; values[ind++] = -1; }
        if (left  != -1) { col_inds[ind] = left;  values[ind++] = -1; }

        col_inds[ind] = center; values[ind++] = 4;

        if (right != -1) { col_inds[ind] = right; values[ind++] = -1; }
        if (upper != -1) { col_inds[ind] = upper; values[ind++] = -1; }

        row_ptrs[i+1] = ind;
    }
    col_inds.resize(ind);
    values  .resize(ind);
}